

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O0

int ON_Intersect(ON_Arc *A0,ON_Arc *A1,ON_3dPoint *P0,ON_3dPoint *P1)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  ON_3dVector *this;
  ON_3dVector *v;
  long lVar4;
  double dVar5;
  double dVar6;
  ON_3dPoint local_240;
  ON_3dPoint local_228;
  ON_3dPoint local_210;
  ON_3dPoint local_1f8;
  ON_3dPoint local_1e0;
  undefined1 local_1c1;
  undefined1 auStack_1c0 [7];
  bool Orientation_agree;
  double local_1b8;
  double local_1b0;
  ON_3dPoint local_1a8;
  ON_3dPoint local_190;
  ON_3dPoint local_178;
  undefined1 local_160 [8];
  ON_3dPoint LittleEnd;
  double t_1;
  undefined1 auStack_138 [4];
  int ei;
  double local_128 [2];
  undefined1 local_118 [8];
  ON_Interval BigInterior;
  double LittleEndMatch [2];
  ON_Interval local_e8;
  ON_Arc *local_d8;
  ON_Arc *Size [2];
  ON_3dPoint local_b0;
  double local_98;
  double t;
  int i;
  int cxcnt;
  ON_3dPoint CCX [2];
  double local_50;
  double abstol;
  double scale0;
  ON_3dPoint *pOStack_38;
  int xcnt;
  ON_3dPoint *P [2];
  ON_3dPoint *P1_local;
  ON_3dPoint *P0_local;
  ON_Arc *A1_local;
  ON_Arc *A0_local;
  
  P1->x = ON_3dPoint::UnsetPoint.x;
  P1->y = ON_3dPoint::UnsetPoint.y;
  P1->z = ON_3dPoint::UnsetPoint.z;
  P0->x = P1->x;
  P0->y = P1->y;
  P0->z = P1->z;
  scale0._4_4_ = 0;
  pOStack_38 = P0;
  P[0] = P1;
  P[1] = P1;
  dVar5 = ON_Circle::MaximumCoordinate(&A0->super_ON_Circle);
  local_50 = ON_Circle::MaximumCoordinate(&A1->super_ON_Circle);
  if (local_50 < dVar5) {
    local_50 = dVar5;
  }
  local_50 = local_50 * 2.2737367544323206e-13;
  if (local_50 < 2.3283064365386963e-10) {
    local_50 = 2.3283064365386963e-10;
  }
  t._4_4_ = ON_Intersect(&A0->super_ON_Circle,&A1->super_ON_Circle,(ON_3dPoint *)&i,
                         (ON_3dPoint *)&CCX[0].z);
  if (t._4_4_ < 3) {
    for (t._0_4_ = 0; t._0_4_ < t._4_4_; t._0_4_ = t._0_4_ + 1) {
      bVar2 = ON_Arc::ClosestPointTo(A0,(ON_3dPoint *)(&i + (long)t._0_4_ * 6),&local_98);
      if (bVar2) {
        lVar4 = (long)t._0_4_;
        ON_Circle::PointAt(&local_b0,&A0->super_ON_Circle,local_98);
        dVar5 = ON_3dPoint::DistanceTo((ON_3dPoint *)(&i + lVar4 * 6),&local_b0);
        if ((dVar5 < local_50) &&
           (bVar2 = ON_Arc::ClosestPointTo(A1,(ON_3dPoint *)(&i + (long)t._0_4_ * 6),&local_98),
           bVar2)) {
          lVar4 = (long)t._0_4_;
          ON_Circle::PointAt((ON_3dPoint *)(Size + 1),&A1->super_ON_Circle,local_98);
          dVar5 = ON_3dPoint::DistanceTo((ON_3dPoint *)(&i + lVar4 * 6),(ON_3dPoint *)(Size + 1));
          if (dVar5 < local_50) {
            lVar4 = (long)t._0_4_;
            puVar1 = *(undefined8 **)((long)&stack0xffffffffffffffc8 + (long)scale0._4_4_ * 8);
            *puVar1 = *(undefined8 *)(&i + lVar4 * 6);
            puVar1[1] = CCX[lVar4].x;
            puVar1[2] = CCX[lVar4].y;
            scale0._4_4_ = scale0._4_4_ + 1;
          }
        }
      }
    }
  }
  else if (t._4_4_ == 3) {
    local_d8 = A0;
    Size[0] = A1;
    local_e8 = ON_Arc::Domain(A0);
    dVar5 = ON_Interval::Length(&local_e8);
    join_0x00001240_0x00001200_ = ON_Arc::Domain(A1);
    dVar6 = ON_Interval::Length((ON_Interval *)(LittleEndMatch + 1));
    if (dVar6 < dVar5) {
      local_d8 = A1;
      Size[0] = A0;
    }
    _local_118 = ON_Arc::Domain(Size[0]);
    dVar5 = ON_Circle::Radius(&Size[0]->super_ON_Circle);
    bVar2 = ON_Interval::Expand((ON_Interval *)local_118,-local_50 / dVar5);
    if (!bVar2) {
      _auStack_138 = ON_Arc::Domain(Size[0]);
      dVar5 = ON_Interval::Mid((ON_Interval *)auStack_138);
      local_128 = (double  [2])ON_Interval::Singleton(dVar5);
      _local_118 = (ON_Interval)local_128;
    }
    for (t_1._4_4_ = 0; t_1._4_4_ < 2; t_1._4_4_ = t_1._4_4_ + 1) {
      if (t_1._4_4_ == 0) {
        ON_Arc::StartPoint((ON_3dPoint *)local_160,local_d8);
      }
      else {
        ON_Arc::EndPoint((ON_3dPoint *)local_160,local_d8);
      }
      bVar2 = ON_Arc::ClosestPointTo(Size[0],(ON_3dPoint *)local_160,&LittleEnd.z);
      if (bVar2) {
        iVar3 = ON_Interval::Clamp((ON_Interval *)local_118,&LittleEnd.z);
        if (iVar3 == -1) {
          ON_Arc::StartPoint(&local_178,Size[0]);
          dVar5 = ON_3dPoint::DistanceTo(&local_178,(ON_3dPoint *)local_160);
          if (local_50 <= dVar5) {
            BigInterior.m_t[(long)t_1._4_4_ + 1] = -1.0;
          }
          else {
            BigInterior.m_t[(long)t_1._4_4_ + 1] = 0.0;
          }
        }
        else if (iVar3 == 0) {
          BigInterior.m_t[(long)t_1._4_4_ + 1] = 0.5;
        }
        else if (iVar3 == 1) {
          ON_Arc::EndPoint(&local_190,Size[0]);
          dVar5 = ON_3dPoint::DistanceTo(&local_190,(ON_3dPoint *)local_160);
          if (local_50 <= dVar5) {
            BigInterior.m_t[(long)t_1._4_4_ + 1] = -1.0;
          }
          else {
            BigInterior.m_t[(long)t_1._4_4_ + 1] = 1.0;
          }
        }
      }
    }
    if (((BigInterior.m_t[1] == 0.5) && (!NAN(BigInterior.m_t[1]))) ||
       ((LittleEndMatch[0] == 0.5 && (!NAN(LittleEndMatch[0]))))) {
      scale0._4_4_ = 3;
    }
    else if ((((BigInterior.m_t[1] != -1.0) || (NAN(BigInterior.m_t[1]))) ||
             (LittleEndMatch[0] != -1.0)) || (NAN(LittleEndMatch[0]))) {
      if ((BigInterior.m_t[1] != -1.0) || (NAN(BigInterior.m_t[1]))) {
        if ((LittleEndMatch[0] != -1.0) || (NAN(LittleEndMatch[0]))) {
          this = ON_Circle::Normal(&A0->super_ON_Circle);
          v = ON_Circle::Normal(&A1->super_ON_Circle);
          dVar5 = ON_3dVector::operator*(this,v);
          local_1c1 = 0.0 < dVar5;
          if ((BigInterior.m_t[1] != LittleEndMatch[0]) ||
             (NAN(BigInterior.m_t[1]) || NAN(LittleEndMatch[0]))) {
            if ((bool)local_1c1 == (BigInterior.m_t[1] == 1.0)) {
              ON_Arc::StartPoint(&local_1e0,local_d8);
              pOStack_38->x = local_1e0.x;
              pOStack_38->y = local_1e0.y;
              pOStack_38->z = local_1e0.z;
              ON_Arc::EndPoint(&local_1f8,local_d8);
              scale0._4_4_ = 2;
              P[0]->x = local_1f8.x;
              P[0]->y = local_1f8.y;
              P[0]->z = local_1f8.z;
            }
            else {
              scale0._4_4_ = 3;
            }
          }
          else {
            ON_Arc::StartPoint(&local_210,local_d8);
            ON_Arc::EndPoint(&local_228,local_d8);
            dVar5 = ON_3dPoint::DistanceTo(&local_210,&local_228);
            if (local_50 <= dVar5) {
              scale0._4_4_ = 3;
            }
            else {
              ON_Arc::StartPoint(&local_240,local_d8);
              scale0._4_4_ = 1;
              pOStack_38->x = local_240.x;
              pOStack_38->y = local_240.y;
              pOStack_38->z = local_240.z;
            }
          }
        }
        else {
          ON_Arc::StartPoint((ON_3dPoint *)auStack_1c0,local_d8);
          scale0._4_4_ = 1;
          pOStack_38->x = _auStack_1c0;
          pOStack_38->y = local_1b8;
          pOStack_38->z = local_1b0;
        }
      }
      else {
        ON_Arc::EndPoint(&local_1a8,local_d8);
        scale0._4_4_ = 1;
        pOStack_38->x = local_1a8.x;
        pOStack_38->y = local_1a8.y;
        pOStack_38->z = local_1a8.z;
      }
    }
    else {
      scale0._4_4_ = 0;
    }
  }
  return scale0._4_4_;
}

Assistant:

int ON_Intersect(
  const ON_Arc& A0,
  const ON_Arc& A1,
  ON_3dPoint& P0,
  ON_3dPoint& P1)
{
  P0 = P1 = ON_3dPoint::UnsetPoint;
  ON_3dPoint* P[] = { &P0, &P1 };
  int xcnt = 0;

  double scale0 = A0.MaximumCoordinate();
  double abstol = A1.MaximumCoordinate();
  if (abstol < scale0)
    abstol = scale0;
  abstol *= ON_RELATIVE_TOLERANCE;
  if (abstol < ON_ZERO_TOLERANCE)
    abstol = ON_ZERO_TOLERANCE;


  ON_3dPoint CCX[2];
  int cxcnt = ON_Intersect(static_cast<const ON_Circle&>(A0), static_cast<const ON_Circle&>(A1), CCX[0], CCX[1]);
  if ( cxcnt < 3)
  {
    for (int i = 0; i < cxcnt; i++)
    {
      double t;
      if (A0.ClosestPointTo(CCX[i], &t))
      {
        if (CCX[i].DistanceTo(A0.PointAt(t)) < abstol)
        {
          if (A1.ClosestPointTo(CCX[i], &t))
          {
            if (CCX[i].DistanceTo(A1.PointAt(t)) < abstol)
              *P[xcnt++] = CCX[i];
          }
        }
      }
    }
  }
  else if (cxcnt == 3)
  {
    // circle doesn't degenerate to a point
    // order arcs by size
    const  ON_Arc* Size[] = { &A0, &A1 };     //Size[0]<=Size[1]
    if (A0.Domain().Length() > A1.Domain().Length())
    {
      Size[0] = &A1;
      Size[1] = &A0;
    }

    // Match ends of smaller to larger arc
    double LittleEndMatch[2];  // relative to Big ArcBig,  0-start, 1-end , .5 (interior),  -1 ( exterior)

    ON_Interval BigInterior = Size[1]->Domain();    // interior domain of big arc
    if (!BigInterior.Expand(-abstol / Size[1]->Radius()))         // circles are not degenerate
      BigInterior = ON_Interval::Singleton(Size[1]->Domain().Mid());
    
    for (int ei = 0; ei < 2; ei++)
    {
      double t;
      ON_3dPoint LittleEnd = ei ? Size[0]->EndPoint() : Size[0]->StartPoint();
      if (Size[1]->ClosestPointTo(LittleEnd, &t))
      {
        switch (BigInterior.Clamp(t))
        {
        case(-1):
          if (Size[1]->StartPoint().DistanceTo(LittleEnd) < abstol)
            LittleEndMatch[ei] = 0;   // start
          else
            LittleEndMatch[ei] = -1;  // exterior
          break;
        case(0):
          LittleEndMatch[ei] = .5;    // interior
          break;
        case(1):
          if (Size[1]->EndPoint().DistanceTo(LittleEnd) < abstol)
            LittleEndMatch[ei] = 1;       // end
          else
            LittleEndMatch[ei] = -1;     // exterior
          break;
        }
      }
    }

    if (LittleEndMatch[0] == .5 || LittleEndMatch[1] == .5)
      xcnt = 3;     // an interior match means an overlap
    else if (LittleEndMatch[0] == -1 && LittleEndMatch[1] == -1)
      xcnt = 0;     // both points exterior means  intersection is empty
    else if (LittleEndMatch[0] == -1)
      *P[xcnt++] = Size[0]->EndPoint();    // if start is exterior end must be an intersection point
    else if (LittleEndMatch[1] == -1)
      *P[xcnt++] = Size[0]->StartPoint();
    else
    {
      // Both endpoints match endpoints of Big
      // LittleEndMatch[ei] \in { 0, 1 }
      bool Orientation_agree = (A0.Normal() * A1.Normal() > 0);     // true if  the orientations agree
      if (LittleEndMatch[0] != LittleEndMatch[1])
      {
        if (Orientation_agree == (LittleEndMatch[0] == 1.0))
        {
          *P[xcnt++] = Size[0]->StartPoint();
          *P[xcnt++] = Size[0]->EndPoint();
        }
        else
          xcnt = 3;
      }
      else
      {
        // Degenerate cases
        if (Size[0]->StartPoint().DistanceTo(Size[0]->EndPoint()) < abstol)
          *P[xcnt++] = Size[0]->StartPoint();
        else
          xcnt = 3;
      }
    }
  }
  
  return xcnt;
}